

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O2

void NHandyPack::
     TVectorSerializer<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_unsigned_char>::
     Dump(ostream *out,vector<unsigned_char,_std::allocator<unsigned_char>_> *object)

{
  pointer puVar1;
  uchar *obj;
  pointer object_00;
  undefined1 local_24 [8];
  uint32_t size;
  
  std::ostream::write((char *)out,(long)local_24);
  puVar1 = (object->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (object_00 = (object->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start; object_00 != puVar1;
      object_00 = object_00 + 1) {
    TPodSerializer<unsigned_char>::Dump(out,object_00);
  }
  return;
}

Assistant:

static inline void Dump(std::ostream& out, const TVec& object) {
        uint32_t size = object.size();
        out.write((const char*)(&size), sizeof(size));
        for (const auto& obj: object) {
            NHandyPack::Dump(out, obj);
        }
    }